

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_movem_16_re_al(void)

{
  uint uVar1;
  int local_18;
  uint local_14;
  uint count;
  uint ea;
  uint register_list;
  uint i;
  
  ea = 0;
  uVar1 = m68ki_read_imm_16();
  local_14 = m68ki_read_imm_32();
  local_18 = 0;
  for (; ea < 0x10; ea = ea + 1) {
    if ((uVar1 & 1 << ((byte)ea & 0x1f)) != 0) {
      m68ki_write_16_fc(local_14,m68ki_cpu.s_flag | 1,m68ki_cpu.dar[ea] & 0xffff);
      local_14 = local_14 + 2;
      local_18 = local_18 + 1;
    }
  }
  m68ki_remaining_cycles =
       m68ki_remaining_cycles - (local_18 << ((byte)m68ki_cpu.cyc_movem_w & 0x1f));
  return;
}

Assistant:

static void m68k_op_movem_16_re_al(void)
{
	uint i = 0;
	uint register_list = OPER_I_16();
	uint ea = EA_AL_16();
	uint count = 0;

	for(; i < 16; i++)
		if(register_list & (1 << i))
		{
			m68ki_write_16(ea, MASK_OUT_ABOVE_16(REG_DA[i]));
			ea += 2;
			count++;
		}

	USE_CYCLES(count<<CYC_MOVEM_W);
}